

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall
Connection_componentConnectionAndParseMissingVariable_Test::TestBody
          (Connection_componentConnectionAndParseMissingVariable_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  char *pcVar2;
  element_type *peVar3;
  AssertHelper local_188 [8];
  Message local_180 [8];
  undefined1 local_178 [8];
  AssertionResult gtest_ar_2;
  string a;
  PrinterPtr printer;
  Message local_130 [8];
  shared_ptr<libcellml::Issue> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_1;
  Message local_e0 [8];
  unsigned_long local_d8 [2];
  undefined1 local_c8 [8];
  AssertionResult gtest_ar;
  ModelPtr model;
  ParserPtr parser;
  undefined1 local_90 [8];
  string expectIssue;
  undefined1 local_68 [8];
  string e;
  allocator<char> local_31;
  string local_30 [8];
  string s;
  Connection_componentConnectionAndParseMissingVariable_Test *this_local;
  
  s.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model name=\"\" xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component name=\"component_dave\">\n    <variable name=\"variable_dave\" units=\"dimensionless\"/>\n  </component>\n  <component name=\"component_bob\">\n    <variable name=\"variable_bob\" units=\"dimensionless\"/>\n  </component>\n  <connection component_1=\"component_dave\" component_2=\"component_bob\">\n    <map_variables variable_1=\"variable_angus\" variable_2=\"variable_bob\"/>\n  </connection>\n</model>\n"
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <component name=\"component_dave\">\n    <variable name=\"variable_dave\" units=\"dimensionless\"/>\n  </component>\n  <component name=\"component_bob\">\n    <variable name=\"variable_bob\" units=\"dimensionless\"/>\n  </component>\n</model>\n"
             ,(allocator<char> *)(expectIssue.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(expectIssue.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,
             "Variable \'variable_angus\' is specified as variable_1 in a connection but it does not exist in component_1 component \'component_dave\' of model \'\'."
             ,(allocator<char> *)
              ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  this_00 = &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  libcellml::Parser::parseModel((string *)&gtest_ar.message_);
  local_d8[1] = 1;
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_d8[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_c8,"size_t(1)","parser->issueCount()",local_d8 + 1,local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x519,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  libcellml::Logger::issue((ulong)&local_128);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_128);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_f8,"expectIssue","parser->issue(0)->description()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
             &local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x51b,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,local_130);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    testing::Message::~Message(local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  libcellml::Printer::create();
  peVar3 = std::__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(a.field_2._M_local_buf + 8));
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&gtest_ar_2.message_,SUB81(peVar3,0));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_178,"e","a",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_2.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(local_180);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              (local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x51f,pcVar2);
    testing::internal::AssertHelper::operator=(local_188,local_180);
    testing::internal::AssertHelper::~AssertHelper(local_188);
    testing::Message::~Message(local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
  std::shared_ptr<libcellml::Printer>::~shared_ptr
            ((shared_ptr<libcellml::Printer> *)((long)&a.field_2 + 8));
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)&gtest_ar.message_)
  ;
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Connection, componentConnectionAndParseMissingVariable)
{
    const std::string s =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model name=\"\" xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component_dave\">\n"
        "    <variable name=\"variable_dave\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "  <component name=\"component_bob\">\n"
        "    <variable name=\"variable_bob\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "  <connection component_1=\"component_dave\" component_2=\"component_bob\">\n"
        "    <map_variables variable_1=\"variable_angus\" variable_2=\"variable_bob\"/>\n"
        "  </connection>\n"
        "</model>\n";
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component_dave\">\n"
        "    <variable name=\"variable_dave\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "  <component name=\"component_bob\">\n"
        "    <variable name=\"variable_bob\" units=\"dimensionless\"/>\n"
        "  </component>\n"
        "</model>\n";

    const std::string expectIssue = "Variable 'variable_angus' is specified as variable_1 in a connection but it does not exist in component_1 component 'component_dave' of model ''.";

    // Parse
    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(s);
    EXPECT_EQ(size_t(1), parser->issueCount());

    EXPECT_EQ(expectIssue, parser->issue(0)->description());

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(model);
    EXPECT_EQ(e, a);
}